

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::shiftSignificandLeft(IEEEFloat *this,uint bits)

{
  uint uVar1;
  bool bVar2;
  uint Words;
  Significand *Dst;
  Significand *src;
  
  uVar1 = this->semantics->precision;
  if (uVar1 <= bits) {
    __assert_fail("bits < semantics->precision",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x498,"void llvm::detail::IEEEFloat::shiftSignificandLeft(unsigned int)");
  }
  if (bits != 0) {
    Words = uVar1 + 0x40 >> 6;
    src = &this->significand;
    Dst = src;
    if (uVar1 - 0x40 < 0xffffff80) {
      Dst = (Significand *)(this->significand).parts;
    }
    APInt::tcShiftLeft(&Dst->part,Words,bits);
    this->exponent = this->exponent - (short)bits;
    if (this->semantics->precision - 0x40 < 0xffffff80) {
      src = (Significand *)(this->significand).parts;
    }
    bVar2 = APInt::tcIsZero(&src->part,Words);
    if (bVar2) {
      __assert_fail("!APInt::tcIsZero(significandParts(), partsCount)",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x4a0,"void llvm::detail::IEEEFloat::shiftSignificandLeft(unsigned int)");
    }
  }
  return;
}

Assistant:

void IEEEFloat::shiftSignificandLeft(unsigned int bits) {
  assert(bits < semantics->precision);

  if (bits) {
    unsigned int partsCount = partCount();

    APInt::tcShiftLeft(significandParts(), partsCount, bits);
    exponent -= bits;

    assert(!APInt::tcIsZero(significandParts(), partsCount));
  }
}